

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O0

void integer_suite::test_literal_zero_one(void)

{
  string local_218 [40];
  undefined4 local_1f0;
  int local_1ec;
  size_type local_1e8 [2];
  undefined4 local_1d8;
  int local_1d4;
  size_type local_1d0 [3];
  undefined1 local_1b8 [8];
  writer writer;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)local_1b8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1d4 = 0;
  local_1d0[0] = trial::protocol::json::basic_writer<char,_16UL>::value<int>
                           ((basic_writer<char,_16UL> *)local_1b8,&local_1d4);
  local_1d8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(0)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7c,"void integer_suite::test_literal_zero_one()",local_1d0,&local_1d8);
  local_1ec = 1;
  local_1e8[0] = trial::protocol::json::basic_writer<char,_16UL>::value<int>
                           ((basic_writer<char,_16UL> *)local_1b8,&local_1ec);
  local_1f0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(1)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7d,"void integer_suite::test_literal_zero_one()",local_1e8,&local_1f0);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"0,1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x7e,"void integer_suite::test_literal_zero_one()",local_218,"0,1");
  std::__cxx11::string::~string(local_218);
  trial::protocol::json::basic_writer<char,_16UL>::~basic_writer
            ((basic_writer<char,_16UL> *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_literal_zero_one()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(0), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(1), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "0,1");
}